

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-literal.cc
# Opt level: O2

void __thiscall ParseUint64_Basic_Test::TestBody(ParseUint64_Basic_Test *this)

{
  anon_unknown.dwarf_7da04::AssertUint64Equals(0,"0");
  anon_unknown.dwarf_7da04::AssertUint64Equals(1000,"1000");
  anon_unknown.dwarf_7da04::AssertUint64Equals(0x75bcd15,"123456789");
  anon_unknown.dwarf_7da04::AssertUint64Equals(0x1999999999999999,"1844674407370955161");
  anon_unknown.dwarf_7da04::AssertUint64Equals(0xffffffffffffffff,"18446744073709551615");
  anon_unknown.dwarf_7da04::AssertUint64Equals(0,"0x0");
  anon_unknown.dwarf_7da04::AssertUint64Equals(0x1000,"0x1000");
  anon_unknown.dwarf_7da04::AssertUint64Equals(0x123456789,"0x123456789");
  anon_unknown.dwarf_7da04::AssertUint64Equals(0xabcdef,"0xabcdef");
  anon_unknown.dwarf_7da04::AssertUint64Equals(0xffffffffffffff,"0xffffffffffffff");
  anon_unknown.dwarf_7da04::AssertUint64Equals(0xfffffffffffffff,"0xfffffffffffffff");
  anon_unknown.dwarf_7da04::AssertUint64Equals(0xabcdefabcdefabcd,"0xabcdefabcdefabcd");
  return;
}

Assistant:

TEST(ParseUint64, Basic) {
  AssertUint64Equals(0, "0");
  AssertUint64Equals(1000, "1000");
  AssertUint64Equals(123456789, "123456789");
  AssertUint64Equals(1844674407370955161ull, "1844674407370955161");
  AssertUint64Equals(18446744073709551615ull, "18446744073709551615");

  AssertUint64Equals(0, "0x0");
  AssertUint64Equals(0x1000, "0x1000");
  AssertUint64Equals(0x123456789, "0x123456789");
  AssertUint64Equals(0xabcdef, "0xabcdef");
  AssertUint64Equals(0xffffffffffffffull, "0xffffffffffffff");
  AssertUint64Equals(0xfffffffffffffffull, "0xfffffffffffffff");

  AssertUint64Equals(0xabcdefabcdefabcdull, "0xabcdefabcdefabcd");
}